

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improvePartitions(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                    *this)

{
  uint uVar1;
  _Bit_type *p_Var2;
  _Bit_type *p_Var3;
  ulong *puVar4;
  pointer puVar5;
  pointer pAVar6;
  size_t partition;
  long lVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pVVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  pointer pAVar22;
  ulong uVar23;
  size_t local_80;
  
  lVar7 = (long)(this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 6;
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var3 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar13 = 0;
    do {
      uVar20 = uVar13 + 0x3f;
      if (-1 < (long)uVar13) {
        uVar20 = uVar13;
      }
      lVar21 = (long)uVar20 >> 6;
      uVar19 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
      uVar20 = 1L << ((byte)uVar13 & 0x3f);
      uVar23 = ~uVar20;
      if ((p_Var2[lVar21 + uVar19 + 0xffffffffffffffff] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar20 = p_Var3[lVar21 + uVar19 + 0xffffffffffffffff] & uVar23;
      }
      else {
        uVar20 = uVar20 | p_Var3[lVar21 + uVar19 + 0xffffffffffffffff];
      }
      p_Var3[lVar21 + uVar19 + 0xffffffffffffffff] = uVar20;
      puVar8 = p_Var2 + lVar21 + uVar19 + 0xffffffffffffffff;
      *puVar8 = *puVar8 & uVar23;
      uVar13 = uVar13 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar13);
  }
  puVar8 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar4 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  iVar17 = 0;
  if (uVar1 != 0 || puVar8 != puVar4) {
    iVar17 = 0;
    uVar13 = 0;
    do {
      iVar17 = iVar17 + (uint)((*puVar8 >> (uVar13 & 0x3f) & 1) != 0);
      iVar18 = (int)uVar13;
      puVar8 = puVar8 + (iVar18 == 0x3f);
      uVar13 = (ulong)(iVar18 + 1);
      if (iVar18 == 0x3f) {
        uVar13 = 0;
      }
    } while ((uint)uVar13 != uVar1 || puVar8 != puVar4);
  }
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0xf;
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  if ((long)(this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    local_80 = 0;
  }
  else {
    lVar7 = 0x50;
    local_80 = 0;
    uVar13 = 0;
    do {
      uVar20 = uVar13 + 1;
      if (uVar20 < (ulong)((long)(this->partitionGraph_).
                                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                                 vertices_.
                                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->partitionGraph_).
                                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                                 vertices_.
                                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 6)) {
        uVar19 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar19 = uVar13;
        }
        uVar15 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
        uVar10 = 1L << ((byte)uVar13 & 0x3f);
        uVar23 = uVar20;
        lVar21 = lVar7;
        do {
          puVar5 = (this->partitionGraph_).partitions_.
                   super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (puVar5[uVar13]._M_h._M_element_count == 0) break;
          if (*(long *)((long)&(puVar5->_M_h)._M_buckets + lVar21) != 0) {
            p_Var2 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if ((p_Var2[((long)uVar19 >> 6) + uVar15 + 0xffffffffffffffff] & uVar10) == 0) {
              uVar14 = uVar23 + 0x3f;
              if (-1 < (long)uVar23) {
                uVar14 = uVar23;
              }
              if ((p_Var2[((long)uVar14 >> 6) +
                          (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar23 & 0x3f) & 1) == 0) goto LAB_0013b44f;
            }
            sVar12 = PartitionGraph::frameOfPartition(&this->partitionGraph_,uVar13);
            sVar11 = PartitionGraph::frameOfPartition(&this->partitionGraph_,uVar23);
            if ((sVar12 == sVar11) && (sVar12 = improveBipartition(this,uVar13,uVar23), sVar12 != 0)
               ) {
              p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              puVar8 = p_Var2 + ((long)uVar19 >> 6) + uVar15 + 0xffffffffffffffff;
              *puVar8 = *puVar8 | uVar10;
              uVar14 = uVar23 + 0x3f;
              if (-1 < (long)uVar23) {
                uVar14 = uVar23;
              }
              puVar8 = p_Var2 + ((long)uVar14 >> 6) +
                                (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) +
                                0xffffffffffffffff;
              *puVar8 = *puVar8 | 1L << ((byte)uVar23 & 0x3f);
              local_80 = local_80 + sVar12;
              HeuristicBase::logObj(&this->super_HeuristicBase);
            }
          }
LAB_0013b44f:
          uVar23 = uVar23 + 1;
          lVar21 = lVar21 + 0x38;
        } while (uVar23 < (ulong)((long)(this->partitionGraph_).
                                        super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
                                        .vertices_.
                                        super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->partitionGraph_).
                                        super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
                                        .vertices_.
                                        super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      lVar7 = lVar7 + 0x38;
      uVar13 = uVar20;
    } while (uVar20 < ((long)(this->partitionGraph_).
                             super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                             vertices_.
                             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->partitionGraph_).
                             super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
                             vertices_.
                             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 6) - 1U);
  }
  pVVar16 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
      vertices_.
      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish == pVVar16) {
    uVar13 = 0;
  }
  else {
    uVar20 = 0;
    do {
      uVar13 = uVar20 + 0x3f;
      if (-1 < (long)uVar20) {
        uVar13 = uVar20;
      }
      uVar19 = (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001);
      if ((((this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
            [((long)uVar13 >> 6) + uVar19 + 0xffffffffffffffff] >> (uVar20 & 0x3f) & 1) != 0) &&
         (sVar12 = splitPartition(this,uVar20), sVar12 != 0)) {
        puVar8 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 ((long)uVar13 >> 6) + uVar19 + 0xffffffffffffffff;
        *puVar8 = *puVar8 | 1L << ((byte)uVar20 & 0x3f);
        local_80 = local_80 + sVar12;
        HeuristicBase::logObj(&this->super_HeuristicBase);
      }
      uVar20 = uVar20 + 1;
      pVVar16 = (this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(this->partitionGraph_).
                     super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >> 6;
    } while (uVar20 < uVar13);
  }
  if (uVar13 != 0) {
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var3 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar20 = 0;
    do {
      uVar19 = uVar20 + 0x3f;
      if (-1 < (long)uVar20) {
        uVar19 = uVar20;
      }
      lVar7 = (long)uVar19 >> 6;
      uVar23 = (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001);
      uVar19 = 1L << ((byte)uVar20 & 0x3f);
      if ((p_Var2[lVar7 + uVar23 + 0xffffffffffffffff] >> (uVar20 & 0x3f) & 1) == 0) {
        uVar19 = ~uVar19 & p_Var3[lVar7 + uVar23 + 0xffffffffffffffff];
      }
      else {
        uVar19 = uVar19 | p_Var3[lVar7 + uVar23 + 0xffffffffffffffff];
      }
      p_Var3[lVar7 + uVar23 + 0xffffffffffffffff] = uVar19;
      uVar20 = uVar20 + 1;
    } while (uVar13 != uVar20);
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var3 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar20 = 0;
    do {
      uVar19 = uVar20 + 0x3f;
      if (-1 < (long)uVar20) {
        uVar19 = uVar20;
      }
      uVar23 = (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001);
      if (((p_Var2[((long)uVar19 >> 6) + uVar23 + 0xffffffffffffffff] >> (uVar20 & 0x3f) & 1) != 0)
         && ((p_Var3[((long)uVar19 >> 6) + uVar23 + 0xffffffffffffffff] &
             1L << ((byte)uVar20 & 0x3f)) != 0)) {
        pAVar6 = pVVar16[uVar20].to_.vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar22 = pVVar16[uVar20].to_.vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar22 != pAVar6;
            pAVar22 = pAVar22 + 1) {
          uVar19 = pAVar22->vertex_;
          uVar23 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar23 = uVar19;
          }
          p_Var2[((long)uVar23 >> 6) +
                 (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
               p_Var2[((long)uVar23 >> 6) +
                      (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] | 1L << ((byte)uVar19 & 0x3f);
        }
        pAVar6 = pVVar16[uVar20].from_.vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar22 = pVVar16[uVar20].from_.vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar22 != pAVar6;
            pAVar22 = pAVar22 + 1) {
          uVar19 = pAVar22->vertex_;
          uVar23 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar23 = uVar19;
          }
          p_Var2[((long)uVar23 >> 6) +
                 (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
               p_Var2[((long)uVar23 >> 6) +
                      (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] | 1L << ((byte)uVar19 & 0x3f);
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar13);
  }
  return local_80;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improvePartitions()
{
    size_t numberOfMoves = 0;

    // update "dirty" flags.
    for (size_t idx = 0; idx < partitionGraph_.numberOfVertices(); ++idx) {
        needsUpdate_[idx] = changed_[idx];
        changed_[idx] = false;
    }

    {
        // complete info line.
        const auto numberOfUpdatedCells =
            std::accumulate(needsUpdate_.cbegin(), needsUpdate_.cend(), 0);
        std::cout << std::setw(WIDTH) << numberOfUpdatedCells << std::endl;
    }

    for (size_t partitionA = 0;
         partitionA < partitionGraph_.numberOfVertices() - 1; ++partitionA) {

        for (size_t partitionB = partitionA + 1;
             partitionB < partitionGraph_.numberOfVertices(); ++partitionB) {

            if (partitionGraph_.partitions_[partitionA].empty())
                break;
            if (partitionGraph_.partitions_[partitionB].empty())
                continue;

            // check if "dirty"
            if (!needsUpdate_[partitionA] && !needsUpdate_[partitionB]) {
                continue;
            }

            // check whether the partitions are in the same frame.
            // proximity (i.e. presence of an edge between them) will be
            // tested
            // implicitly in improveBipartition.
            if (partitionGraph_.frameOfPartition(partitionA) !=
                partitionGraph_.frameOfPartition(partitionB)) {
                continue;
            }

            const auto additionalMoves =
                improveBipartition(partitionA, partitionB);

            if (additionalMoves > 0) {
                changed_[partitionA] = true;
                changed_[partitionB] = true;
                numberOfMoves += additionalMoves;

                this->logObj();
            }
        }
    }

    // introduce new partitions.
    for (size_t partitionA = 0; partitionA < partitionGraph_.numberOfVertices();
         ++partitionA) {
        if (!needsUpdate_[partitionA]) {
            continue;
        }

        const auto additionalMoves = splitPartition(partitionA);

        if (additionalMoves > 0) {
            changed_[partitionA] = true;
            numberOfMoves += additionalMoves;

            this->logObj();
        }
    }

    // propagate "changed" flags along branching edges.
    // First, transfer flags to needsUpdate_ to prevent propagation
    // in the entire connected component.
    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition]) {
            needsUpdate_[partition] = true;
        } else {
            needsUpdate_[partition] = false;
        }
    }

    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition] && needsUpdate_[partition]) {

            for (auto it = partitionGraph_.verticesFromVertexBegin(partition);
                 it != partitionGraph_.verticesFromVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }

            for (auto it = partitionGraph_.verticesToVertexBegin(partition);
                 it != partitionGraph_.verticesToVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }
        }
    }

    return numberOfMoves;
}